

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create_table.cpp
# Opt level: O2

unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
__thiscall
duckdb::Binder::BindCreateTableInfo
          (Binder *this,
          unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *info,
          SchemaCatalogEntry *schema,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *bound_defaults)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  size_type *this_01;
  vector<duckdb::PhysicalIndex,_true> *indexes;
  __node_base_ptr *this_02;
  __node_base_ptr p_Var1;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var2;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> _Var3;
  optional_ptr<duckdb::Catalog,_true> oVar4;
  unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *puVar5;
  pointer pbVar6;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> uVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  pointer pCVar11;
  pointer pBVar12;
  type stmt;
  ulong uVar13;
  reference pvVar14;
  reference pvVar15;
  ColumnDefinition *pCVar16;
  LogicalType *pLVar17;
  type pBVar18;
  reference this_03;
  pointer pCVar19;
  ForeignKeyConstraint *fk;
  CatalogEntry *pCVar20;
  TableCatalogEntry *this_04;
  ColumnList *pCVar21;
  vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
  *constraints;
  undefined4 extraout_var;
  string *psVar22;
  NotNullConstraint *pNVar23;
  CheckConstraint *pCVar24;
  type expr;
  UniqueConstraint *this_05;
  LogicalIndex logical;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *pvVar25;
  size_type sVar26;
  Catalog *pCVar27;
  pointer pBVar28;
  StatementProperties *pSVar29;
  NotImplementedException *this_06;
  BinderException *pBVar30;
  LogicalType *type;
  LogicalType *type_00;
  idx_t i;
  ulong __n;
  PhysicalIndex PVar31;
  pointer __k;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *in_R8;
  unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *this_07;
  ColumnListIterator CVar32;
  allocator local_3e9;
  pointer local_3e8;
  pointer local_3e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  target_col_names;
  undefined8 local_3c0;
  BoundStatement query_obj;
  undefined1 local_370 [32];
  optional_ptr<duckdb::CatalogEntry,_true> table_entry;
  ColumnList new_colums;
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
  bound_constraints;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  _Any_data local_290;
  code *local_280;
  code *local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  LogicalType local_250;
  LogicalType local_238;
  string local_220;
  string local_200;
  ColumnDefinition local_1e0;
  ColumnDefinition local_108;
  
  pCVar11 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
            operator->((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                        *)schema);
  make_uniq<duckdb::BoundCreateTableInfo,duckdb::SchemaCatalogEntry&,duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>>
            ((duckdb *)this,(SchemaCatalogEntry *)bound_defaults,
             (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)schema
            );
  pBVar12 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
            ::operator->((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                          *)this);
  bound_constraints.
  super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bound_constraints.
  super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bound_constraints.
  super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3e0 = pCVar11;
  if (pCVar11[1].dependencies.set._M_h._M_single_bucket == (__node_base_ptr)0x0) {
    local_290._M_unused._M_object = &pBVar12->dependencies;
    local_278 = ::std::
                _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/statement/bind_create_table.cpp:599:28)>
                ::_M_invoke;
    local_280 = ::std::
                _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/statement/bind_create_table.cpp:599:28)>
                ::_M_manager;
    local_290._8_8_ = bound_defaults;
    SetCatalogLookupCallback((Binder *)info,(catalog_entry_callback_t *)&local_290);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_290);
    pBVar18 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
              ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                           *)this);
    CreateColumnDependencyManager(pBVar18);
    pBVar18 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
              ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                           *)this);
    BindGeneratedColumns((Binder *)info,pBVar18);
    this_00 = &pCVar11[1].catalog.field_2;
    for (PVar31.index = 0;
        PVar31.index <
        (ulong)((long)local_3e0[1].dependencies.set._M_h._M_buckets -
                *(long *)((long)&local_3e0[1].sql.field_2 + 8) >> 3);
        PVar31.index = PVar31.index + 1) {
      pCVar16 = ColumnList::GetColumnMutable((ColumnList *)this_00,PVar31);
      pLVar17 = ColumnDefinition::Type(pCVar16);
      if (pLVar17->id_ == VARCHAR) {
        _Var3._M_head_impl =
             info[2].super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
             super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
        pLVar17 = ColumnDefinition::Type(pCVar16);
        StringType::GetCollation_abi_cxx11_((string *)&new_colums,(StringType *)pLVar17,type_00);
        ExpressionBinder::TestCollation((ClientContext *)_Var3._M_head_impl,(string *)&new_colums);
        ::std::__cxx11::string::~string((string *)&new_colums);
      }
      pLVar17 = ColumnDefinition::TypeMutable(pCVar16);
      pBVar12 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                ::operator->((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                              *)this);
      oVar4.ptr = (pBVar12->schema->super_InCatalogEntry).catalog;
      pBVar12 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                ::operator->((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                              *)this);
      BindLogicalType((Binder *)info,pLVar17,oVar4,
                      &(pBVar12->schema->super_InCatalogEntry).super_CatalogEntry.name);
    }
    new_colums.columns.
    super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
    super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&new_colums.name_map._M_h._M_element_count;
    new_colums.columns.
    super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
    super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x1;
    new_colums.columns.
    super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
    super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    new_colums.name_map._M_h._M_buckets = (__buckets_ptr)0x0;
    new_colums.name_map._M_h._M_bucket_count._0_4_ = 0x3f800000;
    new_colums.name_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    new_colums.name_map._M_h._M_element_count = 0;
    this_01 = &pCVar11[1].dependencies.set._M_h._M_element_count;
    local_3e8 = pCVar11 + 1;
    for (uVar13 = 0;
        uVar13 < (ulong)((long)(*(long *)&local_3e0[1].dependencies.set._M_h._M_rehash_policy -
                               local_3e0[1].dependencies.set._M_h._M_element_count) >> 3);
        uVar13 = uVar13 + 1) {
      this_03 = vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                ::get<true>((vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                             *)this_01,uVar13);
      pCVar19 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                operator->(this_03);
      if (pCVar19->type == FOREIGN_KEY) {
        pCVar19 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                  operator->(this_03);
        fk = Constraint::Cast<duckdb::ForeignKeyConstraint>(pCVar19);
        if ((fk->info).type == FK_TYPE_FOREIGN_KEY_TABLE) {
          if (((fk->info).pk_keys.
               super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
               super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
               _M_impl.super__Vector_impl_data._M_start !=
               (fk->info).pk_keys.
               super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
               super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
               _M_impl.super__Vector_impl_data._M_finish) &&
             ((fk->info).fk_keys.
              super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
              super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              (fk->info).fk_keys.
              super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
              super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
              _M_impl.super__Vector_impl_data._M_finish)) break;
          FindForeignKeyIndexes((ColumnList *)this_00,&fk->fk_columns,&(fk->info).fk_keys);
          psVar22 = &(fk->info).table;
          bVar8 = StringUtil::CIEquals((string *)local_3e8,(string *)psVar22);
          indexes = &(fk->info).pk_keys;
          if (bVar8) {
            (fk->info).type = FK_TYPE_SELF_REFERENCE_TABLE;
            FindMatchingPrimaryKeyColumns
                      ((ColumnList *)this_00,
                       (vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                        *)this_01,fk);
            FindForeignKeyIndexes((ColumnList *)this_00,&fk->pk_columns,indexes);
            CheckForeignKeyTypes((ColumnList *)this_00,(ColumnList *)this_00,fk);
          }
          else {
            EntryLookupInfo::EntryLookupInfo
                      ((EntryLookupInfo *)&query_obj,TABLE_ENTRY,psVar22,
                       (QueryErrorContext)0xffffffffffffffff);
            ::std::__cxx11::string::string
                      ((string *)&target_col_names,anon_var_dwarf_3b2a81b + 9,(allocator *)local_370
                      );
            table_entry = CatalogEntryRetriever::GetEntry
                                    ((CatalogEntryRetriever *)(info + 0x5c),
                                     (string *)&target_col_names,&(fk->info).schema,
                                     (EntryLookupInfo *)&query_obj,THROW_EXCEPTION);
            ::std::__cxx11::string::~string((string *)&target_col_names);
            pCVar20 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&table_entry);
            if (pCVar20->type == VIEW_ENTRY) {
              pBVar30 = (BinderException *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&target_col_names,"cannot reference a VIEW with a FOREIGN KEY",
                         (allocator *)local_370);
              BinderException::BinderException(pBVar30,(string *)&target_col_names);
              __cxa_throw(pBVar30,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
            }
            this_04 = (TableCatalogEntry *)
                      optional_ptr<duckdb::CatalogEntry,_true>::operator->(&table_entry);
            if ((this_04->super_StandardEntry).schema != (SchemaCatalogEntry *)bound_defaults) {
              pBVar30 = (BinderException *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&target_col_names,
                         "Creating foreign keys across different schemas or catalogs is not supported"
                         ,(allocator *)local_370);
              BinderException::BinderException(pBVar30,(string *)&target_col_names);
              __cxa_throw(pBVar30,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
            }
            pCVar21 = TableCatalogEntry::GetColumns(this_04);
            constraints = TableCatalogEntry::GetConstraints(this_04);
            FindMatchingPrimaryKeyColumns(pCVar21,constraints,fk);
            pCVar21 = TableCatalogEntry::GetColumns(this_04);
            FindForeignKeyIndexes(pCVar21,&fk->pk_columns,indexes);
            pCVar21 = TableCatalogEntry::GetColumns(this_04);
            CheckForeignKeyTypes(pCVar21,(ColumnList *)this_00,fk);
            iVar10 = (*(this_04->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                       _vptr_CatalogEntry[0x10])(this_04);
            bVar8 = DataTable::HasForeignKeyIndex
                              ((DataTable *)CONCAT44(extraout_var,iVar10),indexes,
                               FK_TYPE_PRIMARY_KEY_TABLE);
            if (!bVar8) {
              ::std::__cxx11::string::string((string *)local_370,",",(allocator *)&local_2b0);
              StringUtil::Join((string *)&target_col_names,&fk->pk_columns,(string *)local_370);
              ::std::__cxx11::string::~string((string *)local_370);
              pBVar30 = (BinderException *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)local_370,
                         "Failed to create foreign key on %s(%s): no UNIQUE or PRIMARY KEY constraint present on these columns"
                         ,&local_3e9);
              ::std::__cxx11::string::string
                        ((string *)&local_2b0,
                         (string *)
                         &(this_04->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                          name);
              ::std::__cxx11::string::string((string *)&local_270,(string *)&target_col_names);
              BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                        (pBVar30,(string *)local_370,&local_2b0,&local_270);
              __cxa_throw(pBVar30,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
            }
          }
        }
      }
    }
    ::std::
    _Hashtable<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&new_colums);
    new_colums.columns.
    super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
    super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&new_colums.name_map._M_h._M_element_count;
    new_colums.columns.
    super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
    super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x1;
    new_colums.columns.
    super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
    super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    new_colums.name_map._M_h._M_buckets = (__buckets_ptr)0x0;
    new_colums.name_map._M_h._M_bucket_count._0_4_ = 0x3f800000;
    new_colums.name_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    new_colums.name_map._M_h._M_element_count = 0;
    CVar32 = ColumnList::Logical((ColumnList *)this_00);
    local_370._0_8_ = CVar32.list;
    local_370[8] = CVar32.physical;
    ColumnList::ColumnListIterator::begin
              ((ColumnLogicalIteratorInternal *)&query_obj,(ColumnListIterator *)local_370);
    ColumnList::ColumnListIterator::end
              ((ColumnLogicalIteratorInternal *)&target_col_names,(ColumnListIterator *)local_370);
    while ((((pointer)query_obj.types.
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_finish !=
             target_col_names.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage ||
            (query_obj.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
             .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage != (pointer)local_3c0)) ||
           (query_obj.plan.
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
            (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
            target_col_names.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start))) {
      pCVar16 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                          ((ColumnLogicalIteratorInternal *)&query_obj);
      bVar8 = ColumnDefinition::Generated(pCVar16);
      if (bVar8) {
        psVar22 = ColumnDefinition::Name_abi_cxx11_(pCVar16);
        ::std::__detail::
        _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)&new_colums,psVar22);
      }
      query_obj.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)&(query_obj.types.
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->physical_type_;
    }
    if (new_colums.name_map._M_h._M_buckets != (__buckets_ptr)0x0) {
      puVar5 = *(unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> **)
                &local_3e0[1].dependencies.set._M_h._M_rehash_policy;
      for (this_07 = (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                      *)local_3e0[1].dependencies.set._M_h._M_element_count; this_07 != puVar5;
          this_07 = this_07 + 1) {
        pCVar19 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                  operator->(this_07);
        switch(pCVar19->type) {
        case NOT_NULL:
          pCVar19 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                    operator->(this_07);
          pNVar23 = Constraint::Cast<duckdb::NotNullConstraint>(pCVar19);
          pCVar16 = ColumnList::GetColumn
                              ((ColumnList *)this_00,(LogicalIndex)(pNVar23->index).index);
          cVar9 = ColumnDefinition::Generated(pCVar16);
          goto joined_r0x012b71ed;
        case CHECK:
          pCVar19 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                    operator->(this_07);
          pCVar24 = Constraint::Cast<duckdb::CheckConstraint>(pCVar19);
          query_obj.plan.
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
               ((ulong)query_obj.plan.
                       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl &
               0xffffffffffffff00);
          expr = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator*(&pCVar24->expression);
          ExpressionContainsGeneratedColumn
                    (expr,(unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&new_colums,(bool *)&query_obj);
          cVar9 = (char)query_obj.plan.
                        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
joined_r0x012b71ed:
          if (cVar9 != '\0') {
LAB_012b7261:
            ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)&new_colums);
            pBVar30 = (BinderException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&new_colums,
                       "Constraints on generated columns are not supported yet",
                       (allocator *)&query_obj);
            BinderException::BinderException(pBVar30,(string *)&new_colums);
            __cxa_throw(pBVar30,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          break;
        case UNIQUE:
          pCVar19 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                    operator->(this_07);
          this_05 = Constraint::Cast<duckdb::UniqueConstraint>(pCVar19);
          bVar8 = UniqueConstraint::HasIndex(this_05);
          if (bVar8) {
            logical = UniqueConstraint::GetIndex(this_05);
            pCVar16 = ColumnList::GetColumn((ColumnList *)this_00,logical);
            cVar9 = ColumnDefinition::Generated(pCVar16);
            goto joined_r0x012b71ed;
          }
          pvVar25 = UniqueConstraint::GetColumnNames_abi_cxx11_(this_05);
          __k = (pvVar25->
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
          pbVar6 = (pvVar25->
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          while (__k != pbVar6) {
            sVar26 = ::std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                              *)&new_colums,__k);
            __k = __k + 1;
            if (sVar26 != 0) goto LAB_012b7261;
          }
          break;
        case FOREIGN_KEY:
          break;
        default:
          this_06 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&query_obj,"ConstraintType not implemented",
                     (allocator *)&target_col_names);
          NotImplementedException::NotImplementedException(this_06,(string *)&query_obj);
          __cxa_throw(this_06,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
      }
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&new_colums);
    BindNewConstraints((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
                        *)&new_colums,(Binder *)info,
                       (vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                        *)this_01,(string *)local_3e8,(ColumnList *)this_00);
    ::std::
    vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    ::_M_move_assign(&bound_constraints.
                      super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
                     ,&new_colums);
    ::std::
    vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
               *)&new_colums);
    pCVar27 = (Catalog *)
              (*(code *)(bound_defaults->
                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ).
                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[0xb].
                        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                        ._M_t)();
    psVar22 = Catalog::GetName_abi_cxx11_(pCVar27);
    BindDefaultValues((Binder *)info,(ColumnList *)this_00,in_R8,psVar22,
                      (string *)
                      &bound_defaults[1].
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  else {
    this_02 = &pCVar11[1].dependencies.set._M_h._M_single_bucket;
    stmt = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>::
           operator*((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                      *)this_02);
    Bind(&query_obj,(Binder *)info,stmt);
    p_Var1 = *this_02;
    *this_02 = (__node_base_ptr)0x0;
    if (p_Var1 != (__node_base_ptr)0x0) {
      (*(code *)p_Var1->_M_nxt[1]._M_nxt)();
    }
    pBVar12 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
              ::operator->((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                            *)this);
    uVar7 = query_obj.plan;
    query_obj.plan.
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
          )0x0;
    _Var2._M_head_impl =
         (pBVar12->query).
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (pBVar12->query).
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (LogicalOperator *)
         uVar7.
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    if (_Var2._M_head_impl != (LogicalOperator *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_LogicalOperator + 8))();
    }
    local_3e8 = (pointer)&pCVar11[1].catalog.field_2;
    ColumnList::GetColumnNames_abi_cxx11_(&target_col_names,(ColumnList *)local_3e8);
    *(undefined1 *)&local_3e0[1].dependencies.set._M_h._M_before_begin._M_nxt = 1;
    if (target_col_names.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        target_col_names.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      for (uVar13 = 0;
          uVar13 < (ulong)((long)query_obj.names.
                                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)query_obj.names.
                                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5);
          uVar13 = uVar13 + 1) {
        pvVar14 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::get<true>(&query_obj.names,uVar13);
        ::std::__cxx11::string::string((string *)&local_220,(string *)pvVar14);
        pvVar15 = vector<duckdb::LogicalType,_true>::get<true>(&query_obj.types,uVar13);
        LogicalType::LogicalType(&local_250,pvVar15);
        ColumnDefinition::ColumnDefinition(&local_1e0,&local_220,&local_250);
        ColumnList::AddColumn((ColumnList *)local_3e8,&local_1e0);
        ColumnDefinition::~ColumnDefinition(&local_1e0);
        LogicalType::~LogicalType(&local_250);
        ::std::__cxx11::string::~string((string *)&local_220);
      }
    }
    else {
      __n = (long)target_col_names.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)target_col_names.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
      uVar13 = ((long)query_obj.types.
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)query_obj.types.
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x18;
      if (uVar13 < __n) {
        pBVar30 = (BinderException *)
                  __cxa_allocate_exception
                            (0x10,query_obj.types.
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  .
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                             ((long)query_obj.types.
                                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    .
                                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)query_obj.types.
                                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                   .
                                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                   ._M_impl.super__Vector_impl_data._M_start) % 0x18);
        ::std::__cxx11::string::string
                  ((string *)&new_colums,"Target table has more colum names than query result.",
                   (allocator *)local_370);
        BinderException::BinderException(pBVar30,(string *)&new_colums);
        __cxa_throw(pBVar30,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (__n < uVar13) {
        for (; __n < (ulong)(((long)query_obj.types.
                                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    .
                                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)query_obj.types.
                                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                   .
                                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x18); __n = __n + 1
            ) {
          pvVar14 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::get<true>(&query_obj.names,__n);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&target_col_names,pvVar14);
        }
      }
      ColumnList::ColumnList(&new_colums,false);
      for (uVar13 = 0;
          uVar13 < (ulong)((long)target_col_names.
                                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)target_col_names.
                                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5);
          uVar13 = uVar13 + 1) {
        pvVar14 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::get<true>(&target_col_names,uVar13);
        ::std::__cxx11::string::string((string *)&local_200,(string *)pvVar14);
        pvVar15 = vector<duckdb::LogicalType,_true>::get<true>(&query_obj.types,uVar13);
        LogicalType::LogicalType(&local_238,pvVar15);
        ColumnDefinition::ColumnDefinition(&local_108,&local_200,&local_238);
        ColumnList::AddColumn(&new_colums,&local_108);
        ColumnDefinition::~ColumnDefinition(&local_108);
        LogicalType::~LogicalType(&local_238);
        ::std::__cxx11::string::~string((string *)&local_200);
      }
      ColumnList::operator=((ColumnList *)local_3e8,&new_colums);
      ColumnList::~ColumnList(&new_colums);
    }
    for (PVar31.index = 0;
        PVar31.index <
        (ulong)((long)local_3e0[1].dependencies.set._M_h._M_buckets -
                *(long *)((long)&local_3e0[1].sql.field_2 + 8) >> 3);
        PVar31.index = PVar31.index + 1) {
      pCVar16 = ColumnList::GetColumnMutable((ColumnList *)local_3e8,PVar31);
      pLVar17 = ColumnDefinition::Type(pCVar16);
      if (pLVar17->id_ == VARCHAR) {
        _Var3._M_head_impl =
             info[2].super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
             super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
        pLVar17 = ColumnDefinition::Type(pCVar16);
        StringType::GetCollation_abi_cxx11_((string *)&new_colums,(StringType *)pLVar17,type);
        ExpressionBinder::TestCollation((ClientContext *)_Var3._M_head_impl,(string *)&new_colums);
        ::std::__cxx11::string::~string((string *)&new_colums);
      }
      pLVar17 = ColumnDefinition::TypeMutable(pCVar16);
      pBVar12 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                ::operator->((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                              *)this);
      oVar4.ptr = (pBVar12->schema->super_InCatalogEntry).catalog;
      pBVar12 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                ::operator->((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                              *)this);
      BindLogicalType((Binder *)info,pLVar17,oVar4,
                      &(pBVar12->schema->super_InCatalogEntry).super_CatalogEntry.name);
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&target_col_names);
    BoundStatement::~BoundStatement(&query_obj);
  }
  if (local_3e0[1].dependencies.set._M_h._M_buckets ==
      *(__buckets_ptr *)((long)&local_3e0[1].sql.field_2 + 8)) {
    pBVar30 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&new_colums,
               "Creating a table without physical (non-generated) columns is not supported",
               (allocator *)&query_obj);
    BinderException::BinderException(pBVar30,(string *)&new_colums);
    __cxa_throw(pBVar30,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pBVar12 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
            ::operator->((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                          *)this);
  pCVar27 = (Catalog *)
            bound_defaults[9].
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pBVar28 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
            ::operator->((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                          *)this);
  pCVar11 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
            operator->(&pBVar28->base);
  LogicalDependencyList::VerifyDependencies(&pBVar12->dependencies,pCVar27,(string *)(pCVar11 + 1));
  pSVar29 = GetStatementProperties((Binder *)info);
  pSVar29->allow_stream_result = false;
  ::std::
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  ::~vector(&bound_constraints.
             super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
           );
  return (unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
          )(unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
            )this;
}

Assistant:

unique_ptr<BoundCreateTableInfo> Binder::BindCreateTableInfo(unique_ptr<CreateInfo> info, SchemaCatalogEntry &schema,
                                                             vector<unique_ptr<Expression>> &bound_defaults) {
	auto &base = info->Cast<CreateTableInfo>();
	auto result = make_uniq<BoundCreateTableInfo>(schema, std::move(info));
	auto &dependencies = result->dependencies;

	vector<unique_ptr<BoundConstraint>> bound_constraints;
	if (base.query) {
		// construct the result object
		auto query_obj = Bind(*base.query);
		base.query.reset();
		result->query = std::move(query_obj.plan);

		// construct the set of columns based on the names and types of the query
		auto &names = query_obj.names;
		auto &sql_types = query_obj.types;
		// e.g. create table (col1 ,col2) as QUERY
		// col1 and col2 are the target_col_names
		auto target_col_names = base.columns.GetColumnNames();
		// TODO check  types and target_col_names are mismatch in size
		D_ASSERT(names.size() == sql_types.size());
		base.columns.SetAllowDuplicates(true);
		if (!target_col_names.empty()) {
			if (target_col_names.size() > sql_types.size()) {
				throw BinderException("Target table has more colum names than query result.");
			} else if (target_col_names.size() < sql_types.size()) {
				// filled the target_col_names with the name of query names
				for (idx_t i = target_col_names.size(); i < sql_types.size(); i++) {
					target_col_names.push_back(names[i]);
				}
			}
			ColumnList new_colums;
			for (idx_t i = 0; i < target_col_names.size(); i++) {
				new_colums.AddColumn(ColumnDefinition(target_col_names[i], sql_types[i]));
			}
			base.columns = std::move(new_colums);
		} else {
			for (idx_t i = 0; i < names.size(); i++) {
				base.columns.AddColumn(ColumnDefinition(names[i], sql_types[i]));
			}
		}
		// bind collations to detect any unsupported collation errors
		for (idx_t i = 0; i < base.columns.PhysicalColumnCount(); i++) {
			auto &column = base.columns.GetColumnMutable(PhysicalIndex(i));
			if (column.Type().id() == LogicalTypeId::VARCHAR) {
				ExpressionBinder::TestCollation(context, StringType::GetCollation(column.Type()));
			}
			BindLogicalType(column.TypeMutable(), &result->schema.catalog, result->schema.name);
		}
	} else {
		SetCatalogLookupCallback([&dependencies, &schema](CatalogEntry &entry) {
			if (&schema.ParentCatalog() != &entry.ParentCatalog()) {
				// Don't register dependencies between catalogs
				return;
			}
			dependencies.AddDependency(entry);
		});
		CreateColumnDependencyManager(*result);
		// bind the generated column expressions
		BindGeneratedColumns(*result);
		// bind any constraints

		// bind collations to detect any unsupported collation errors
		for (idx_t i = 0; i < base.columns.PhysicalColumnCount(); i++) {
			auto &column = base.columns.GetColumnMutable(PhysicalIndex(i));
			if (column.Type().id() == LogicalTypeId::VARCHAR) {
				ExpressionBinder::TestCollation(context, StringType::GetCollation(column.Type()));
			}
			BindLogicalType(column.TypeMutable(), &result->schema.catalog, result->schema.name);
		}
		BindCreateTableConstraints(base, entry_retriever, schema);

		if (AnyConstraintReferencesGeneratedColumn(base)) {
			throw BinderException("Constraints on generated columns are not supported yet");
		}
		bound_constraints = BindNewConstraints(base.constraints, base.table, base.columns);
		// bind the default values
		auto &catalog_name = schema.ParentCatalog().GetName();
		auto &schema_name = schema.name;
		BindDefaultValues(base.columns, bound_defaults, catalog_name, schema_name);
	}

	if (base.columns.PhysicalColumnCount() == 0) {
		throw BinderException("Creating a table without physical (non-generated) columns is not supported");
	}

	result->dependencies.VerifyDependencies(schema.catalog, result->Base().table);

	auto &properties = GetStatementProperties();
	properties.allow_stream_result = false;
	return result;
}